

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

size_t __thiscall Server::loadToxFileSize(Server *this)

{
  size_t sVar1;
  Server *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_258;
  string local_238;
  ifstream loadFile;
  byte abStack_1f8 [488];
  
  getDataDir_abi_cxx11_(&local_238,in_RSI);
  std::operator+(&bStack_258,&local_238,"profile_000.tox");
  std::ifstream::ifstream(&loadFile,(string *)&bStack_258,_S_in|_S_bin);
  std::__cxx11::string::~string((string *)&bStack_258);
  std::__cxx11::string::~string((string *)&local_238);
  if ((abStack_1f8[*(long *)(_loadFile + -0x18)] & 5) == 0) {
    std::istream::seekg((long)&loadFile,_S_beg);
    sVar1 = std::istream::tellg();
    std::ifstream::close();
  }
  else {
    std::__cxx11::string::string
              ((string *)&bStack_258,"Failed to open tox id file for loading",
               (allocator *)&local_238);
    writeToLog(this,&bStack_258);
    std::__cxx11::string::~string((string *)&bStack_258);
    sVar1 = 0xffffffffffffffff;
  }
  std::ifstream::~ifstream(&loadFile);
  return sVar1;
}

Assistant:

size_t Server::loadToxFileSize() {
    ifstream loadFile(getDataDir() + "profile_000.tox", ios_base::in | ios_base::binary);

    if (!loadFile) {
        writeToLog("Failed to open tox id file for loading");
        return -1;
    }

    loadFile.seekg(0, ios::end);
    size_t fileSize = loadFile.tellg();

    loadFile.close();

    return fileSize;
}